

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O3

char * p2sc_get_keyvalue(p2sc_keyfile_t *k,char *group,char *key)

{
  char *pcVar1;
  GError *err;
  
  err = (GError *)0x0;
  pcVar1 = (char *)g_key_file_get_value(k->key,group,key,&err);
  if ((pcVar1 != (char *)0x0) && (err == (GError *)0x0)) {
    return pcVar1;
  }
  if ((err == (GError *)0x0) || (err->message == (gchar *)0x0)) {
    _p2sc_msg("p2sc_get_keyvalue",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
              ,0x44,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",4000,
              "%s: value of %s not found in group %s",k->name,key,group);
  }
  else {
    _p2sc_msg("p2sc_get_keyvalue",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
              ,0x41,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",4000,"%s: %s",k->name,
              err->message);
  }
  exit(1);
}

Assistant:

char *p2sc_get_keyvalue(p2sc_keyfile_t *k, const char *group, const char *key) {
    GError *err = NULL;
    char *ret = g_key_file_get_value(k->key, group, key, &err);

    if (!ret || err) {
        if (err && err->message) {
            P2SC_Msg(LVL_FATAL, "%s: %s", k->name, err->message);
            g_error_free(err);
        } else
            P2SC_Msg(LVL_FATAL, "%s: value of %s not found in group %s", k->name, key, group);
        /* not reached */
        g_free(ret);
        ret = NULL;
    }
    return ret;
}